

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionBody * __thiscall
Js::ParseableFunctionInfo::ParseAsmJs
          (ParseableFunctionInfo *this,Parser *ps,CompileScriptException *se,
          ParseNodeProg **parseTree)

{
  uint uFunctionNumber;
  uint uScriptId;
  uint uVar1;
  uint uVar2;
  ScriptContext *pSVar3;
  char16 *displayName;
  code *pcVar4;
  char16_t *pcVar5;
  ULONG grfscr_00;
  LPCUTF8 pSrc;
  LPCUTF8 cbLength;
  size_t offset_00;
  byte bVar6;
  ParseNodeProg **pse;
  CompileScriptException *this_00;
  bool bVar7;
  BOOL BVar8;
  uint nestedCount;
  LocalFunctionId functionId;
  Attributes AVar9;
  int iVar10;
  uint uVar11;
  charcount_t cVar12;
  uint uVar13;
  uint32 uVar14;
  ULONG lineNumber;
  undefined4 *puVar15;
  char16_t **ppcVar16;
  Utf8SourceInfo *pUVar17;
  Utf8SourceInfo *this_01;
  SRCINFO *this_02;
  SourceContextInfo *pSVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FunctionBody *pFVar19;
  LocalFunctionId local_90;
  ULONG local_8c;
  uint nextFunctionId;
  uint32 grfscr;
  LPCUTF8 pszStart;
  size_t length;
  ulong uStack_70;
  charcount_t charOffset;
  size_t offset;
  int local_60;
  HRESULT HStack_5c;
  bool isCesu8;
  HRESULT hrParseCodeGen;
  HRESULT hrParser;
  FunctionBody *funcBody;
  FunctionBody *returnFunctionBody;
  ParseNodeProg **parseTree_local;
  CompileScriptException *se_local;
  Parser *ps_local;
  ParseableFunctionInfo *this_local;
  
  returnFunctionBody = (FunctionBody *)parseTree;
  parseTree_local = (ParseNodeProg **)se;
  se_local = (CompileScriptException *)ps;
  ps_local = (Parser *)this;
  BVar8 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  if (BVar8 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa36,"(IsDeferredParseFunction())","IsDeferredParseFunction()");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  if ((*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 9 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa37,"(m_isAsmjsMode)","m_isAsmjsMode");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  funcBody = (FunctionBody *)0x0;
  _hrParseCodeGen = (FunctionBody *)0x0;
  pSVar3 = (this->super_FunctionProxy).m_scriptContext;
  ppcVar16 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                       ((WriteBarrierPtr *)&this->m_displayName);
  displayName = *ppcVar16;
  uVar13 = this->m_displayNameLength;
  uVar11 = this->m_displayShortNameOffset;
  nestedCount = GetNestedCount(this);
  pUVar17 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
  uFunctionNumber = (this->super_FunctionProxy).m_functionNumber;
  this_01 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
  this_02 = Utf8SourceInfo::GetSrcInfo(this_01);
  pSVar18 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_02->sourceContextInfo);
  uScriptId = pSVar18->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
  AVar9 = FunctionProxy::GetAttributes(&this->super_FunctionProxy);
  _hrParseCodeGen =
       FunctionBody::NewFromRecycler
                 (pSVar3,displayName,uVar13,uVar11,nestedCount,pUVar17,uFunctionNumber,uScriptId,
                  functionId,AVar9 & ~(DeferredParse|DeferredDeserialize),
                  Flags_HasNoExplicitReturnValue);
  Copy(this,_hrParseCodeGen);
  pSVar18 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
  bVar7 = SourceContextInfo::IsDynamic(pSVar18);
  if (bVar7) {
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
    if (bVar7) {
      uVar1 = (this->super_FunctionProxy).m_functionNumber;
      iVar10 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])();
      uVar2 = this->m_cchLength;
      uVar13 = GetNestedCount(this);
      pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                          (&(this->super_FunctionProxy).m_utf8SourceInfo);
      uVar11 = Utf8SourceInfo::GetSourceInfoId(pUVar17);
      pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                          (&(this->super_FunctionProxy).m_utf8SourceInfo);
      cVar12 = Utf8SourceInfo::GetCchLength(pUVar17);
      bVar7 = FunctionProxy::GetIsTopLevel(&this->super_FunctionProxy);
      pcVar5 = L"LdFalse";
      if (bVar7) {
        pcVar5 = L"LdTrue";
      }
      Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                    ,(ulong)uVar1,CONCAT44(extraout_var_00,iVar10),(ulong)uVar2,(ulong)uVar13,
                    (ulong)uVar11,cVar12,pcVar5 + 2);
      Output::Flush();
    }
  }
  else {
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
    if (bVar7) {
      uVar1 = (this->super_FunctionProxy).m_functionNumber;
      iVar10 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])();
      uVar2 = this->m_cchLength;
      uVar13 = GetNestedCount(this);
      pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                          (&(this->super_FunctionProxy).m_utf8SourceInfo);
      uVar11 = Utf8SourceInfo::GetSourceInfoId(pUVar17);
      pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                          (&(this->super_FunctionProxy).m_utf8SourceInfo);
      cVar12 = Utf8SourceInfo::GetCchLength(pUVar17);
      bVar7 = FunctionProxy::GetIsTopLevel(&this->super_FunctionProxy);
      pcVar5 = L"LdFalse";
      if (bVar7) {
        pcVar5 = L"LdTrue";
      }
      pSVar18 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
      Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                    ,(ulong)uVar1,CONCAT44(extraout_var,iVar10),(ulong)uVar2,(ulong)uVar13,
                    (ulong)uVar11,cVar12,pcVar5 + 2,(pSVar18->field_5).field_0.url);
      Output::Flush();
    }
  }
  bVar7 = FunctionBody::HasExecutionDynamicProfileInfo(_hrParseCodeGen);
  if (bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa5a,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                "!funcBody->HasExecutionDynamicProfileInfo()");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  HStack_5c = 0;
  local_60 = 0;
  pSVar3 = (this->super_FunctionProxy).m_scriptContext;
  uVar13 = GetSourceIndex(&_hrParseCodeGen->super_ParseableFunctionInfo);
  pUVar17 = ScriptContext::GetSource(pSVar3,uVar13);
  offset._7_1_ = Utf8SourceInfo::IsCesu8(pUVar17);
  uVar13 = StartOffset(this);
  uStack_70 = (ulong)uVar13;
  length._4_4_ = StartInDocument(this);
  uVar13 = LengthInBytes(this);
  pszStart = (LPCUTF8)(ulong)uVar13;
  _nextFunctionId = GetStartOfDocument(this,(char16 *)0x0);
  uVar14 = GetGrfscr(&_hrParseCodeGen->super_ParseableFunctionInfo);
  local_8c = uVar14 | 0x1800000;
  local_90 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)_hrParseCodeGen);
  this_00 = se_local;
  pse = parseTree_local;
  pFVar19 = returnFunctionBody;
  bVar6 = offset._7_1_;
  offset_00 = uStack_70;
  cVar12 = length._4_4_;
  cbLength = pszStart;
  pSrc = _nextFunctionId;
  grfscr_00 = local_8c;
  lineNumber = GetRelativeLineNumber(&_hrParseCodeGen->super_ParseableFunctionInfo);
  pSVar18 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)_hrParseCodeGen);
  HStack_5c = Parser::ParseSourceWithOffset
                        ((Parser *)this_00,(ParseNodeProg **)pFVar19,pSrc,offset_00,(size_t)cbLength
                         ,cVar12,(bool)(bVar6 & 1),grfscr_00,(CompileScriptException *)pse,&local_90
                         ,lineNumber,pSVar18,&_hrParseCodeGen->super_ParseableFunctionInfo);
  if ((-1 < HStack_5c) &&
     ((_hrParseCodeGen->super_ParseableFunctionInfo).deferredParseNextFunctionId != local_90)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa71,
                                "(((HRESULT)(hrParser)<0) || funcBody->deferredParseNextFunctionId == nextFunctionId)"
                                ,
                                "FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId"
                               );
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  if ((HStack_5c < 0) &&
     ((local_60 = MapDeferredReparseError
                            (&stack0xffffffffffffffa4,(CompileScriptException *)parseTree_local),
      -1 < local_60 || (HStack_5c < 0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa75,
                                "(((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0))",
                                "Syntax errors should never be detected on deferred re-parse");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar15 = 0;
  }
  if (HStack_5c < 0) {
    Throw::InternalError();
  }
  if (-1 < local_60) {
    FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,_hrParseCodeGen);
    *(ushort *)&(this->super_FunctionProxy).field_0x45 =
         *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffd | 2;
    pFVar19 = FunctionProxy::GetFunctionBody((FunctionProxy *)_hrParseCodeGen);
    if (pFVar19 != _hrParseCodeGen) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xa8c,"(funcBody->GetFunctionBody() == funcBody)",
                                  "funcBody->GetFunctionBody() == funcBody");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    return _hrParseCodeGen;
  }
  if (local_60 != -0x7ff5ffe4) {
    if (local_60 != -0x7ff8fff2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xa84,"(hrParseCodeGen == ((HRESULT)0x8007000EL))",
                                  "hrParseCodeGen == E_OUTOFMEMORY");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar15 = 0;
    }
    Throw::OutOfMemory();
  }
  Throw::StackOverflow((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
}

Assistant:

FunctionBody* ParseableFunctionInfo::ParseAsmJs(Parser * ps, __out CompileScriptException * se, __out ParseNodeProg ** parseTree)
    {
        Assert(IsDeferredParseFunction());
        Assert(m_isAsmjsMode);

        FunctionBody* returnFunctionBody = nullptr;
        FunctionBody* funcBody = nullptr;

        funcBody = FunctionBody::NewFromRecycler(
            this->m_scriptContext,
            this->m_displayName,
            this->m_displayNameLength,
            this->m_displayShortNameOffset,
            this->GetNestedCount(),
            this->GetUtf8SourceInfo(),
            this->m_functionNumber,
            this->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId,
            this->GetLocalFunctionId(),
            (FunctionInfo::Attributes)(this->GetAttributes() & ~(FunctionInfo::Attributes::DeferredDeserialize | FunctionInfo::Attributes::DeferredParse)),
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

        this->Copy(funcBody);
        PERF_COUNTER_DEC(Code, DeferredFunction);

        if (!this->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
        }

#if ENABLE_PROFILE_INFO
        Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif

        HRESULT hrParser = NO_ERROR;
        HRESULT hrParseCodeGen = NO_ERROR;

        bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

        size_t offset = this->StartOffset();
        charcount_t charOffset = this->StartInDocument();
        size_t length = this->LengthInBytes();

        LPCUTF8 pszStart = this->GetStartOfDocument();

        uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc | fscrDeferredFncExpression;

        uint nextFunctionId = funcBody->GetLocalFunctionId();

        // if parser throws, it will be caught by function trying to bytecode gen the asm.js module, so don't need to catch/rethrow here
        hrParser = ps->ParseSourceWithOffset(parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, se,
                    &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                    funcBody);

        Assert(FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId);
        if (FAILED(hrParser))
        {
            hrParseCodeGen = MapDeferredReparseError(hrParser, *se); // Map certain errors like OOM/SOE
            AssertMsg(FAILED(hrParseCodeGen) && SUCCEEDED(hrParser), "Syntax errors should never be detected on deferred re-parse");
        }

        if (!SUCCEEDED(hrParser))
        {
            Throw::InternalError();
        }
        else if (!SUCCEEDED(hrParseCodeGen))
        {
            if (hrParseCodeGen == VBSERR_OutOfStack)
            {
                Throw::StackOverflow(m_scriptContext, nullptr);
            }
            else
            {
                Assert(hrParseCodeGen == E_OUTOFMEMORY);
                Throw::OutOfMemory();
            }
        }

        UpdateFunctionBodyImpl(funcBody);
        m_hasBeenParsed = true;

        Assert(funcBody->GetFunctionBody() == funcBody);

        returnFunctionBody = funcBody;

        return returnFunctionBody;
    }